

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O1

void __thiscall
mini_bus::
NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::failed(NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this,exception_ptr *ptr)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar3 == 0) {
    pvVar1 = ptr->_M_exception_object;
    if (pvVar1 != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_addref();
    }
    pvVar2 = (this->ex)._M_exception_object;
    (this->ex)._M_exception_object = pvVar1;
    if (pvVar2 != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    std::condition_variable::notify_one();
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

inline void failed(std::exception_ptr ptr) override {
    {
      std::lock_guard lock{mtx};
      ex = ptr;
    }
    cv.notify_one();
  }